

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O2

void duckdb_je_bin_prefork(tsdn_t *tsdn,bin_t *bin,_Bool has_batch)

{
  undefined3 in_register_00000011;
  
  duckdb_je_malloc_mutex_prefork(tsdn,&bin->lock);
  if (CONCAT31(in_register_00000011,has_batch) != 0) {
    duckdb_je_batcher_prefork((tsdn_t *)0x0,(batcher_t *)(bin + 1));
    return;
  }
  return;
}

Assistant:

void
bin_prefork(tsdn_t *tsdn, bin_t *bin, bool has_batch) {
	malloc_mutex_prefork(tsdn, &bin->lock);
	if (has_batch) {
		/*
		 * The batch mutex has lower rank than the bin mutex (as it must
		 * -- it's acquired later).  But during forking, we go
		 *  bin-at-a-time, so that we acquire mutex on bin 0, then on
		 *  the bin 0 batcher, then on bin 1.  This is a safe ordering
		 *  (it's ordered by the index of arenas and bins within those
		 *  arenas), but will trigger witness errors that would
		 *  otherwise force another level of arena forking that breaks
		 *  bin encapsulation (because the witness API doesn't "know"
		 *  about arena or bin ordering -- it just sees that the batcher
		 *  has a lower rank than the bin).  So instead we exclude the
		 *  batcher mutex from witness checking during fork (which is
		 *  the only time we touch multiple bins at once) by passing
		 *  TSDN_NULL.
		 */
		bin_with_batch_t *batched = (bin_with_batch_t *)bin;
		batcher_prefork(TSDN_NULL, &batched->remote_frees);
	}
}